

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableGcCompactSettings(void)

{
  ImChunkStream<ImGuiTableSettings> *this;
  char *pcVar1;
  undefined8 uVar2;
  ImGuiContext_conflict1 *pIVar3;
  ImGuiTableSettings *pIVar4;
  ImGuiTableSettings *__dest;
  int new_capacity;
  ImVector<char> local_38;
  
  pIVar3 = GImGui;
  this = &GImGui->SettingsTables;
  pIVar4 = (ImGuiTableSettings *)(GImGui->SettingsTables).Buf.Data;
  if (pIVar4 != (ImGuiTableSettings *)0x0) {
    pIVar4 = (ImGuiTableSettings *)&pIVar4->SaveFlags;
  }
  new_capacity = 0;
  for (; pIVar4 != (ImGuiTableSettings *)0x0;
      pIVar4 = ImChunkStream<ImGuiTableSettings>::next_chunk(this,pIVar4)) {
    if (pIVar4->ID != 0) {
      new_capacity = new_capacity + pIVar4->ColumnsCount * 0xc + 0x10;
    }
  }
  if (new_capacity != (this->Buf).Size) {
    local_38.Size = 0;
    local_38.Capacity = 0;
    local_38.Data = (char *)0x0;
    ImVector<char>::reserve(&local_38,new_capacity);
    pcVar1 = (pIVar3->SettingsTables).Buf.Data;
    pIVar4 = (ImGuiTableSettings *)(pcVar1 + 4);
    if (pcVar1 == (char *)0x0) {
      pIVar4 = (ImGuiTableSettings *)0x0;
    }
    for (; pIVar4 != (ImGuiTableSettings *)0x0;
        pIVar4 = ImChunkStream<ImGuiTableSettings>::next_chunk(this,pIVar4)) {
      if (pIVar4->ID != 0) {
        __dest = ImChunkStream<ImGuiTableSettings>::alloc_chunk
                           ((ImChunkStream<ImGuiTableSettings> *)&local_38,
                            (long)pIVar4->ColumnsCount * 0xc + 0x10);
        memcpy(__dest,pIVar4,(long)pIVar4->ColumnsCount * 0xc + 0x10);
      }
    }
    uVar2._0_4_ = (pIVar3->SettingsTables).Buf.Size;
    uVar2._4_4_ = (pIVar3->SettingsTables).Buf.Capacity;
    (pIVar3->SettingsTables).Buf.Size = local_38.Size;
    (pIVar3->SettingsTables).Buf.Capacity = local_38.Capacity;
    pcVar1 = (pIVar3->SettingsTables).Buf.Data;
    (pIVar3->SettingsTables).Buf.Data = local_38.Data;
    local_38._0_8_ = uVar2;
    local_38.Data = pcVar1;
    ImVector<char>::~ImVector(&local_38);
  }
  return;
}

Assistant:

void ImGui::TableGcCompactSettings()
{
    ImGuiContext& g = *GImGui;
    int required_memory = 0;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            required_memory += (int)TableSettingsCalcChunkSize(settings->ColumnsCount);
    if (required_memory == g.SettingsTables.Buf.Size)
        return;
    ImChunkStream<ImGuiTableSettings> new_chunk_stream;
    new_chunk_stream.Buf.reserve(required_memory);
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID != 0)
            memcpy(new_chunk_stream.alloc_chunk(TableSettingsCalcChunkSize(settings->ColumnsCount)), settings, TableSettingsCalcChunkSize(settings->ColumnsCount));
    g.SettingsTables.swap(new_chunk_stream);
}